

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O2

string * __thiscall
options::help_abi_cxx11_(string *__return_storage_ptr__,options *this,char *prog)

{
  allocator local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this->valid = false;
  std::__cxx11::string::string
            ((string *)&local_38,"Density of state of square lattice Ising model\n",&local_d9);
  std::operator+(&local_d8,&local_38,"Usage: ");
  std::operator+(&local_b8,&local_d8,prog);
  std::operator+(&local_98,&local_b8," L\n");
  std::operator+(&local_78,&local_98,"       ");
  std::operator+(&local_58,&local_78,prog);
  std::operator+(__return_storage_ptr__,&local_58," Lx Ly\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string help(char *prog) {
    valid = false;
    return std::string("Density of state of square lattice Ising model\n") +
      "Usage: " + prog + " L\n" +
      "       " + prog + " Lx Ly\n";
  }